

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netgroup.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
NetGroupManager::GetGroup(NetGroupManager *this,CNetAddr *address)

{
  const_iterator __position;
  undefined1 uVar1;
  bool bVar2;
  uint32_t uVar3;
  Network NVar4;
  int iVar5;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  uchar *puVar6;
  CNetAddr *in_RDX;
  NetGroupManager *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  size_t num_bytes;
  uint32_t ipv4;
  int nBits;
  int nStartByte;
  int i;
  uint32_t asn;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vchRet;
  vector<unsigned_char,_std::allocator<unsigned_char>_> addr_bytes;
  CNetAddr *in_stack_fffffffffffffef8;
  CNetAddr *in_stack_ffffffffffffff00;
  CNetAddr *in_stack_ffffffffffffff08;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CNetAddr *in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff21;
  undefined1 in_stack_ffffffffffffff22;
  CNetAddr *in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  int iVar7;
  int local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8);
  uVar3 = GetMappedAS(in_RSI,in_RDX);
  if (uVar3 == 0) {
    NVar4 = CNetAddr::GetNetClass(in_stack_ffffffffffffff00);
    local_b = (undefined1)NVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8,
               (value_type_conflict3 *)0x10f3dc2);
    iVar7 = 0;
    uVar1 = CNetAddr::IsLocal(in_stack_ffffffffffffff00);
    if (!(bool)uVar1) {
      in_stack_ffffffffffffff22 = CNetAddr::IsInternal(in_stack_fffffffffffffef8);
      if ((bool)in_stack_ffffffffffffff22) {
        std::array<unsigned_char,_6UL>::size((array<unsigned_char,_6UL> *)in_stack_fffffffffffffef8)
        ;
        iVar7 = 0x50;
      }
      else {
        in_stack_ffffffffffffff21 = CNetAddr::IsRoutable(in_stack_ffffffffffffff08);
        if ((bool)in_stack_ffffffffffffff21) {
          in_stack_ffffffffffffff20 = CNetAddr::HasLinkedIPv4(in_stack_ffffffffffffff08);
          if ((bool)in_stack_ffffffffffffff20) {
            uVar3 = CNetAddr::GetLinkedIPv4(in_stack_ffffffffffffff00);
            uVar1 = (undefined1)(uVar3 >> 0x10);
            local_c = (undefined1)(uVar3 >> 0x18);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffef8,(value_type_conflict3 *)0x10f3ea7);
            local_d = uVar1;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffef8,(value_type_conflict3 *)0x10f3ec6);
            goto LAB_010f4170;
          }
          bVar2 = CNetAddr::IsTor(in_stack_fffffffffffffef8);
          if ((bVar2) || (bVar2 = CNetAddr::IsI2P(in_stack_fffffffffffffef8), bVar2)) {
            iVar7 = 4;
          }
          else {
            bVar2 = CNetAddr::IsCJDNS(in_stack_fffffffffffffef8);
            if (bVar2) {
              iVar7 = 0xc;
            }
            else {
              bVar2 = CNetAddr::IsHeNet(in_stack_ffffffffffffff10);
              if (bVar2) {
                iVar7 = 0x24;
              }
              else {
                iVar7 = 0x20;
              }
            }
          }
        }
      }
    }
    CNetAddr::GetAddrBytes(in_stack_ffffffffffffff58);
    iVar5 = iVar7;
    if (iVar7 < 0) {
      iVar5 = iVar7 + 7;
    }
    __first._M_current = (uchar *)(long)(iVar5 >> 3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_ffffffffffffff08,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_ffffffffffffff00);
    this_00 = &local_28;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff00);
    __last = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)this_00,(difference_type)in_stack_ffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)this_00,(difference_type)in_stack_ffffffffffffff00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)this_00,(difference_type)in_stack_ffffffffffffff00);
    __position._M_current._2_1_ = in_stack_ffffffffffffff6a;
    __position._M_current._0_2_ = in_stack_ffffffffffffff68;
    __position._M_current._3_1_ = in_stack_ffffffffffffff6b;
    __position._M_current._4_4_ = iVar7;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(NVar4,CONCAT13(uVar1,CONCAT12(in_stack_ffffffffffffff22,
                                                      CONCAT11(in_stack_ffffffffffffff21,
                                                               in_stack_ffffffffffffff20)))),
               __position,__first,__last);
    if (0 < iVar7 % 8) {
      puVar6 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffef8);
      if (puVar6 <= __first._M_current) {
        __assert_fail("num_bytes < addr_bytes.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netgroup.cpp"
                      ,0x4a,
                      "std::vector<unsigned char> NetGroupManager::GetGroup(const CNetAddr &) const"
                     );
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                (this_00,(size_type)__first._M_current);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8,
                 (value_type_conflict3 *)0x10f414f);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  }
  else {
    local_9 = 2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8,
               (value_type_conflict3 *)0x10f3d06);
    for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
      local_a = (undefined1)(uVar3 >> (((byte)local_88 & 3) << 3));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8,
                 (value_type_conflict3 *)0x10f3d49);
    }
  }
LAB_010f4170:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> NetGroupManager::GetGroup(const CNetAddr& address) const
{
    std::vector<unsigned char> vchRet;
    // If non-empty asmap is supplied and the address is IPv4/IPv6,
    // return ASN to be used for bucketing.
    uint32_t asn = GetMappedAS(address);
    if (asn != 0) { // Either asmap was empty, or address has non-asmappable net class (e.g. TOR).
        vchRet.push_back(NET_IPV6); // IPv4 and IPv6 with same ASN should be in the same bucket
        for (int i = 0; i < 4; i++) {
            vchRet.push_back((asn >> (8 * i)) & 0xFF);
        }
        return vchRet;
    }

    vchRet.push_back(address.GetNetClass());
    int nStartByte{0};
    int nBits{0};

    if (address.IsLocal()) {
        // all local addresses belong to the same group
    } else if (address.IsInternal()) {
        // All internal-usage addresses get their own group.
        // Skip over the INTERNAL_IN_IPV6_PREFIX returned by CAddress::GetAddrBytes().
        nStartByte = INTERNAL_IN_IPV6_PREFIX.size();
        nBits = ADDR_INTERNAL_SIZE * 8;
    } else if (!address.IsRoutable()) {
        // all other unroutable addresses belong to the same group
    } else if (address.HasLinkedIPv4()) {
        // IPv4 addresses (and mapped IPv4 addresses) use /16 groups
        uint32_t ipv4 = address.GetLinkedIPv4();
        vchRet.push_back((ipv4 >> 24) & 0xFF);
        vchRet.push_back((ipv4 >> 16) & 0xFF);
        return vchRet;
    } else if (address.IsTor() || address.IsI2P()) {
        nBits = 4;
    } else if (address.IsCJDNS()) {
        // Treat in the same way as Tor and I2P because the address in all of
        // them is "random" bytes (derived from a public key). However in CJDNS
        // the first byte is a constant (see CJDNS_PREFIX), so the random bytes
        // come after it. Thus skip the constant 8 bits at the start.
        nBits = 12;
    } else if (address.IsHeNet()) {
        // for he.net, use /36 groups
        nBits = 36;
    } else {
        // for the rest of the IPv6 network, use /32 groups
        nBits = 32;
    }

    // Push our address onto vchRet.
    auto addr_bytes = address.GetAddrBytes();
    const size_t num_bytes = nBits / 8;
    vchRet.insert(vchRet.end(), addr_bytes.begin() + nStartByte, addr_bytes.begin() + nStartByte + num_bytes);
    nBits %= 8;
    // ...for the last byte, push nBits and for the rest of the byte push 1's
    if (nBits > 0) {
        assert(num_bytes < addr_bytes.size());
        vchRet.push_back(addr_bytes[num_bytes + nStartByte] | ((1 << (8 - nBits)) - 1));
    }

    return vchRet;
}